

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeAddOp4Int(Vdbe *p,int op,int p1,int p2,int p3,int p4)

{
  Op *pOVar1;
  int iVar2;
  VdbeOp *pOp;
  int addr;
  int p4_local;
  int p3_local;
  int p2_local;
  int p1_local;
  int op_local;
  Vdbe *p_local;
  
  iVar2 = sqlite3VdbeAddOp3(p,op,p1,p2,p3);
  if (p->db->mallocFailed == '\0') {
    pOVar1 = p->aOp;
    pOVar1[iVar2].p4type = -3;
    pOVar1[iVar2].p4.i = p4;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOp4Int(
  Vdbe *p,            /* Add the opcode to this VM */
  int op,             /* The new opcode */
  int p1,             /* The P1 operand */
  int p2,             /* The P2 operand */
  int p3,             /* The P3 operand */
  int p4              /* The P4 operand as an integer */
){
  int addr = sqlite3VdbeAddOp3(p, op, p1, p2, p3);
  if( p->db->mallocFailed==0 ){
    VdbeOp *pOp = &p->aOp[addr];
    pOp->p4type = P4_INT32;
    pOp->p4.i = p4;
  }
  return addr;
}